

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cProgramInterfaceQueryTests.cpp
# Opt level: O3

long __thiscall
gl4cts::anon_unknown_0::SeparateProgramsTessEval::Run(SeparateProgramsTessEval *this)

{
  GLenum *pGVar1;
  GLint *pGVar2;
  uint uVar3;
  long lVar4;
  uint program;
  mapped_type *pmVar5;
  GLenum props3 [11];
  long error;
  GLint expected3 [11];
  key_type local_108;
  GLint expected2 [10];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  indicesO;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  indicesI;
  char *srcTCS;
  GLenum props2 [10];
  
  error = 0;
  program = (*(this->super_SeparateProgramsVertex).super_SimpleShaders.super_PIQBase.
              super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x18])(this,0x8e87,1);
  indicesI._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &indicesI._M_t._M_impl.super__Rb_tree_header._M_header;
  indicesI._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  indicesI._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  indicesI._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  indicesO._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &indicesO._M_t._M_impl.super__Rb_tree_header._M_header;
  indicesO._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  indicesO._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  indicesO._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pGVar1 = props3 + 4;
  props3._0_8_ = pGVar1;
  indicesO._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       indicesO._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  indicesI._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       indicesI._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::_M_construct<char_const*>((string *)props3,"gl_PerVertex.gl_Position","");
  (*(this->super_SeparateProgramsVertex).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0xf])(this,(ulong)program,0x92e3,&indicesI,props3,&error);
  if ((GLenum *)props3._0_8_ != pGVar1) {
    operator_delete((void *)props3._0_8_,props3._16_8_ + 1);
  }
  props3._0_8_ = pGVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)props3,"gl_Position","");
  (*(this->super_SeparateProgramsVertex).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0xf])(this,(ulong)program,0x92e4,&indicesO,props3,&error);
  if ((GLenum *)props3._0_8_ != pGVar1) {
    operator_delete((void *)props3._0_8_,props3._16_8_ + 1);
  }
  props3._0_8_ = pGVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)props3,"gl_PerVertex.gl_Position","");
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indicesI,(key_type *)props3);
  uVar3 = *pmVar5;
  pGVar2 = expected3 + 4;
  expected3._0_8_ = pGVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)expected3,"gl_PerVertex.gl_Position","")
  ;
  (*(this->super_SeparateProgramsVertex).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0x10])(this,(ulong)program,0x92e3,(ulong)uVar3,expected3,&error)
  ;
  if ((GLint *)expected3._0_8_ != pGVar2) {
    operator_delete((void *)expected3._0_8_,expected3._16_8_ + 1);
  }
  if ((GLenum *)props3._0_8_ != pGVar1) {
    operator_delete((void *)props3._0_8_,props3._16_8_ + 1);
  }
  props3._0_8_ = pGVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)props3,"gl_Position","");
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indicesO,(key_type *)props3);
  uVar3 = *pmVar5;
  expected3._0_8_ = pGVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)expected3,"gl_Position","");
  (*(this->super_SeparateProgramsVertex).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0x10])(this,(ulong)program,0x92e4,(ulong)uVar3,expected3,&error)
  ;
  if ((GLint *)expected3._0_8_ != pGVar2) {
    operator_delete((void *)expected3._0_8_,expected3._16_8_ + 1);
  }
  if ((GLenum *)props3._0_8_ != pGVar1) {
    operator_delete((void *)props3._0_8_,props3._16_8_ + 1);
  }
  props2[4] = 0x930a;
  props2[5] = 0x9309;
  props2[6] = 0x9307;
  props2[7] = 0x9308;
  props2[0] = 0x92f9;
  props2[1] = 0x92fa;
  props2[2] = 0x92fb;
  props2[3] = 0x930b;
  props2[8] = 0x9306;
  props2[9] = 0x92e7;
  expected2[4] = 0;
  expected2[5] = 0;
  expected2[8] = 0;
  expected2[9] = 0;
  expected2[0] = 0x19;
  expected2[1] = 0x8b52;
  expected2[2] = 1;
  expected2[3] = 0;
  expected2[6] = 0;
  expected2[7] = 1;
  props3._0_8_ = pGVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)props3,"gl_PerVertex.gl_Position","");
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indicesI,(key_type *)props3);
  (*(this->super_SeparateProgramsVertex).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0x13])
            (this,(ulong)program,0x92e3,(ulong)*pmVar5,10,props2,10,expected2,&error);
  if ((GLenum *)props3._0_8_ != pGVar1) {
    operator_delete((void *)props3._0_8_,props3._16_8_ + 1);
  }
  props3[8] = 0x9306;
  props3[9] = 0x92e7;
  props3[10] = 0x930f;
  props3[4] = 0x930a;
  props3[5] = 0x9309;
  props3[6] = 0x9307;
  props3[7] = 0x9308;
  props3[0] = 0x92f9;
  props3[1] = 0x92fa;
  props3[2] = 0x92fb;
  props3[3] = 0x930b;
  expected3[8] = 0;
  expected3[4] = 0;
  expected3[5] = 0;
  expected3[6] = 0;
  expected3[0] = 0xc;
  expected3[1] = 0x8b52;
  expected3[2] = 1;
  expected3[3] = 0;
  expected3[7] = 1;
  expected3[9] = 0;
  expected3[10] = -1;
  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"gl_Position","");
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indicesO,&local_108);
  (*(this->super_SeparateProgramsVertex).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0x13])
            (this,(ulong)program,0x92e4,(ulong)*pmVar5,0xb,props3,0xb,expected3,&error);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::glDeleteProgram
            (&(this->super_SeparateProgramsVertex).super_SimpleShaders.super_PIQBase.
              super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,program);
  lVar4 = error;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~_Rb_tree(&indicesO._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~_Rb_tree(&indicesI._M_t);
  return lVar4;
}

Assistant:

virtual long Run()
	{
		long error = NO_ERROR;

		const char* srcTCS = "#version 430                                                  \n"
							 "layout(quads, equal_spacing, ccw) in;                         \n"
							 "out gl_PerVertex {                                            \n"
							 "   vec4 gl_Position;                                          \n"
							 "   float gl_PointSize;                                        \n"
							 "   float gl_ClipDistance[];                                   \n"
							 "};                                                            \n"
							 ""
							 "in gl_PerVertex {                   \n"
							 "   vec4 gl_Position;                \n"
							 "   float gl_PointSize;              \n"
							 "   float gl_ClipDistance[];         \n"
							 "} gl_in[];                          \n"
							 ""
							 "void main() {                                \n"
							 "   vec4 p0 = gl_in[0].gl_Position;           \n"
							 "   vec4 p1 = gl_in[1].gl_Position;           \n"
							 "   vec4 p2 = gl_in[2].gl_Position;           \n"
							 "   gl_Position = vec4(p0.x, p1.y, p2.z, p0.x);                 \n"
							 "}";

		const GLuint tcs = CreateShaderProgram(GL_TESS_EVALUATION_SHADER, 1, &srcTCS);

		std::map<std::string, GLuint> indicesI;
		std::map<std::string, GLuint> indicesO;
		VerifyGetProgramResourceIndex(tcs, GL_PROGRAM_INPUT, indicesI, "gl_PerVertex.gl_Position", error);
		VerifyGetProgramResourceIndex(tcs, GL_PROGRAM_OUTPUT, indicesO, "gl_Position", error);

		VerifyGetProgramResourceName(tcs, GL_PROGRAM_INPUT, indicesI["gl_PerVertex.gl_Position"],
									 "gl_PerVertex.gl_Position", error);
		VerifyGetProgramResourceName(tcs, GL_PROGRAM_OUTPUT, indicesO["gl_Position"], "gl_Position", error);

		GLenum props2[] = { GL_NAME_LENGTH,
							GL_TYPE,
							GL_ARRAY_SIZE,
							GL_REFERENCED_BY_COMPUTE_SHADER,
							GL_REFERENCED_BY_FRAGMENT_SHADER,
							GL_REFERENCED_BY_GEOMETRY_SHADER,
							GL_REFERENCED_BY_TESS_CONTROL_SHADER,
							GL_REFERENCED_BY_TESS_EVALUATION_SHADER,
							GL_REFERENCED_BY_VERTEX_SHADER,
							GL_IS_PER_PATCH };
		GLint expected2[] = { 25, GL_FLOAT_VEC4, 1, 0, 0, 0, 0, 1, 0, 0 };
		VerifyGetProgramResourceiv(tcs, GL_PROGRAM_INPUT, indicesI["gl_PerVertex.gl_Position"], 10, props2, 10,
								   expected2, error);

		GLenum props3[] = { GL_NAME_LENGTH,
							GL_TYPE,
							GL_ARRAY_SIZE,
							GL_REFERENCED_BY_COMPUTE_SHADER,
							GL_REFERENCED_BY_FRAGMENT_SHADER,
							GL_REFERENCED_BY_GEOMETRY_SHADER,
							GL_REFERENCED_BY_TESS_CONTROL_SHADER,
							GL_REFERENCED_BY_TESS_EVALUATION_SHADER,
							GL_REFERENCED_BY_VERTEX_SHADER,
							GL_IS_PER_PATCH,
							GL_LOCATION_INDEX };
		GLint expected3[] = { 12, GL_FLOAT_VEC4, 1, 0, 0, 0, 0, 1, 0, 0, -1 };
		VerifyGetProgramResourceiv(tcs, GL_PROGRAM_OUTPUT, indicesO["gl_Position"], 11, props3, 11, expected3, error);

		glDeleteProgram(tcs);
		return error;
	}